

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::XThreadEvent::sendReply(XThreadEvent *this)

{
  Executor *pEVar1;
  Impl *pIVar2;
  State *pSVar3;
  EventPort *pEVar4;
  EventPort *p;
  EventPort *_p1073;
  Fault f;
  EventLoop *l;
  EventLoop *_l1051;
  undefined1 local_38 [8];
  Locked<kj::Executor::Impl::State> lock;
  EventLoop *replyLoop;
  Executor *e;
  Executor *_e1046;
  XThreadEvent *this_local;
  
  pEVar1 = readMaybe<kj::Executor_const>(&this->replyExecutor);
  if (pEVar1 != (Executor *)0x0) {
    pIVar2 = Own<kj::Executor::Impl,_std::nullptr_t>::operator->(&pEVar1->impl);
    MutexGuarded<kj::Executor::Impl::State>::lockExclusive
              ((MutexGuarded<kj::Executor::Impl::State> *)local_38,pIVar2);
    pSVar3 = Locked<kj::Executor::Impl::State>::operator->
                       ((Locked<kj::Executor::Impl::State> *)local_38);
    f.exception = (Exception *)readMaybe<kj::EventLoop>(&pSVar3->loop);
    if (f.exception == (Exception *)0x0) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[187]>
                ((Fault *)&_p1073,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x428,FAILED,(char *)0x0,
                 "\"the thread which called kj::Executor::executeAsync() apparently exited its own \" \"event loop without canceling the cross-thread promise first; this is undefined \" \"behavior so I will crash now\""
                 ,(char (*) [187])
                  "the thread which called kj::Executor::executeAsync() apparently exited its own event loop without canceling the cross-thread promise first; this is undefined behavior so I will crash now"
                );
      Debug::Fault::fatal((Fault *)&_p1073);
    }
    pSVar3 = Locked<kj::Executor::Impl::State>::operator->
                       ((Locked<kj::Executor::Impl::State> *)local_38);
    List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>::add(&pSVar3->replies,this);
    lock.ptr = (State *)f.exception;
    Locked<kj::Executor::Impl::State>::~Locked((Locked<kj::Executor::Impl::State> *)local_38);
    pEVar4 = readMaybe<kj::EventPort>((Maybe<kj::EventPort_&> *)lock.ptr);
    if (pEVar4 != (EventPort *)0x0) {
      (*pEVar4->_vptr_EventPort[3])();
    }
  }
  return;
}

Assistant:

void XThreadEvent::sendReply() noexcept {
  KJ_IF_SOME(e, replyExecutor) {
    // Queue the reply.
    const EventLoop* replyLoop;
    {
      auto lock = e.impl->state.lockExclusive();
      KJ_IF_SOME(l, lock->loop) {
        lock->replies.add(*this);
        replyLoop = &l;
      } else {
        // Calling thread exited without cancelling the promise. This is UB. In fact,
        // `replyExecutor` is probably already destroyed and we are in use-after-free territory
        // already. Better abort. (sendReply() is noexcept so that this aborts.)
        //
        // TODO(someday): XThreadPaf had a similar UB case in ~FulfillScope(), but we got rid of it
        //   by holding a strong reference to the Executor. Can we do the same here?
        KJ_FAIL_ASSERT(
            "the thread which called kj::Executor::executeAsync() apparently exited its own "
            "event loop without canceling the cross-thread promise first; this is undefined "
            "behavior so I will crash now");
      }
    }

    // Note that it's safe to assume `replyLoop` still exists even though we dropped the lock
    // because that thread would have had to cancel any promises before destroying its own
    // EventLoop, and when it tries to destroy this promise, it will wait for `state` to become
    // `DONE`, which we don't set until later on. That's nice because wake() probably makes a
    // syscall and we'd rather not hold the lock through syscalls.
    KJ_IF_SOME(p, replyLoop->port) {
      p.wake();
    }
  }